

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_common.h
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::Add
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this,
          FieldDescriptor *field,
          unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
          *field_generator)

{
  Nullable<const_char_*> failure_msg;
  LogMessageFatal local_20;
  
  local_20.super_LogMessage._0_8_ = field->containing_type_;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*>
                          ((Descriptor **)&local_20,&this->descriptor_,
                           "field->containing_type() == descriptor_");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_20.super_LogMessage._0_8_ =
         (field_generator->_M_t).
         super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
         .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
         _M_head_impl;
    (field_generator->_M_t).
    super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
    _M_head_impl = (ImmutableFieldGenerator *)0x0;
    std::
    vector<google::protobuf::compiler::java::ImmutableFieldGenerator_const*,std::allocator<google::protobuf::compiler::java::ImmutableFieldGenerator_const*>>
    ::emplace_back<google::protobuf::compiler::java::ImmutableFieldGenerator_const*>
              ((vector<google::protobuf::compiler::java::ImmutableFieldGenerator_const*,std::allocator<google::protobuf::compiler::java::ImmutableFieldGenerator_const*>>
                *)&this->field_generators_,(ImmutableFieldGenerator **)&local_20);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/generator_common.h"
             ,0x33,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

void Add(const FieldDescriptor* field,
           std::unique_ptr<FieldGeneratorType> field_generator) {
    ABSL_CHECK_EQ(field->containing_type(), descriptor_);
    field_generators_.push_back(field_generator.release());
  }